

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

string * re2c::output_get_state_abi_cxx11_(void)

{
  opt_t *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  poVar1 = Opt::operator->((Opt *)&opts);
  if ((poVar1->state_get_naked & 1U) == 0) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(in_RDI,&poVar1->state_get,"()");
  }
  else {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::__cxx11::string::string((string *)in_RDI,(string *)&poVar1->state_get);
  }
  return in_RDI;
}

Assistant:

std::string output_get_state ()
{
	return opts->state_get_naked
		? opts->state_get
		: opts->state_get + "()";
}